

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# log_aspect_stream.c
# Opt level: O2

int log_aspect_stream_impl_write_execute_cb(log_policy policy,log_aspect_schedule_data data)

{
  int iVar1;
  int iVar2;
  undefined8 *puVar3;
  log_handle handle;
  log_record plVar4;
  int iVar5;
  log_aspect_stream_write_cb_data_type write_data;
  
  puVar3 = (undefined8 *)log_policy_derived(policy);
  handle = log_impl_handle(*data);
  iVar1 = (*(code *)*puVar3)(policy);
  iVar5 = 1;
  if (iVar1 == 0) {
    plVar4 = log_handle_push(handle,*(log_record_ctor *)((long)data + 0x10));
    iVar1 = (*(code *)puVar3[2])(policy);
    if (plVar4 != (log_record)0x0 && iVar1 == 0) {
      write_data.impl = *data;
      write_data.record = plVar4;
      iVar1 = log_aspect_notify_all
                        (*(log_aspect *)((long)data + 8),log_aspect_stream_impl_write_cb,&write_data
                        );
      iVar2 = (*(code *)*puVar3)(policy);
      if (iVar2 == 0) {
        log_handle_pop(handle);
        iVar2 = (*(code *)puVar3[2])(policy);
        iVar5 = 1;
        if (iVar2 == 0) {
          iVar5 = iVar1;
        }
      }
    }
  }
  return iVar5;
}

Assistant:

static int log_aspect_stream_impl_write_execute_cb(log_policy policy, log_aspect_schedule_data data)
{
	log_aspect_stream_execute_cb_data execute_data = data;

	log_policy_schedule_impl schedule_impl = log_policy_derived(policy);

	log_handle handle = log_impl_handle(execute_data->impl);

	log_record record;

	int result;

	struct log_aspect_stream_write_cb_data_type write_data;

	if (schedule_impl->lock(policy) != 0)
	{
		return 1;
	}

	record = log_handle_push(handle, execute_data->record_ctor);

	if (schedule_impl->unlock(policy) != 0)
	{
		return 1;
	}

	if (record == NULL)
	{
		return 1;
	}

	write_data.impl = execute_data->impl;
	write_data.record = record;

	result = log_aspect_notify_all(execute_data->aspect, &log_aspect_stream_impl_write_cb, (log_aspect_notify_data)&write_data);

	if (schedule_impl->lock(policy) != 0)
	{
		return 1;
	}

	log_handle_pop(handle);

	if (schedule_impl->unlock(policy) != 0)
	{
		return 1;
	}

	return result;
}